

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_res.h
# Opt level: O2

void __thiscall
hiberlite::shared_res<hiberlite::statement_ptr>::shared_res
          (shared_res<hiberlite::statement_ptr> *this,statement_ptr *tg)

{
  shared_cnt_obj_pair<hiberlite::statement_ptr> *psVar1;
  logic_error *this_00;
  
  this->_vptr_shared_res = (_func_int **)&PTR__shared_res_001bb6f0;
  this->res = (shared_cnt_obj_pair<hiberlite::statement_ptr> *)0x0;
  if (tg != (statement_ptr *)0x0) {
    psVar1 = (shared_cnt_obj_pair<hiberlite::statement_ptr> *)operator_new(0x18);
    psVar1->_vptr_shared_cnt_obj_pair = (_func_int **)&PTR__shared_cnt_obj_pair_001bb9a8;
    psVar1->res = tg;
    this->res = psVar1;
    psVar1->refCount = 1;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"no reason to manage NULL object");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline explicit shared_res(C* tg) : res(NULL) {
		if(!tg)
			throw std::logic_error("no reason to manage NULL object");
		shared_cnt_obj_pair<C>* share=new shared_cnt_obj_pair<C>(tg);
		takeRes(share);
	}